

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O1

void __thiscall
UnscentedKalmanFilter_computeKalmanGain_Test::TestBody
          (UnscentedKalmanFilter_computeKalmanGain_Test *this)

{
  float *s;
  CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_> *pCVar1;
  CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_> *pCVar2;
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *pCVar3;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *this_00;
  CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> *pCVar4;
  CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *pCVar5;
  char *pcVar6;
  long lVar7;
  CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> *this_01;
  bool bVar8;
  undefined1 local_218 [8];
  UnscentedKalmanFilter<Kalman::Vector<float,_3>_> ukf;
  Scalar local_140;
  Scalar local_13c;
  Scalar local_138;
  Scalar local_134;
  Scalar local_130;
  Scalar local_12c;
  Scalar local_128;
  Matrix<T,_3,_2> P_xy_ref;
  undefined1 local_108 [8];
  Matrix<T,_2,_2> P_yy;
  undefined1 local_f0 [8];
  template_SigmaPoints<decltype(mean)> sigmaPoints;
  Matrix<T,_3,_2> K_ref;
  Vector<float,_2> mean;
  Scalar local_8c;
  Scalar local_88;
  Scalar local_84;
  Scalar local_80;
  Scalar local_7c;
  Scalar local_78;
  Scalar local_74;
  undefined1 local_70 [8];
  Matrix<T,_3,_2> K;
  Scalar local_50 [2];
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  Kalman::UnscentedKalmanFilter<Kalman::Vector<float,_3>_>::UnscentedKalmanFilter
            ((UnscentedKalmanFilter<Kalman::Vector<float,_3>_> *)local_218,1.0,2.0,1.0);
  local_f0 = (undefined1  [8])
             ((long)&ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaWeights_m.
                     super_Matrix<float,_7,_1>.
                     super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.m_storage.m_data +
             0x14);
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[0]
       = 0.0;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[1]
       = 0.0;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[2]
       = 1.4013e-45;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[3]
       = 0.0;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[4]
       = 1.4013e-45;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[5]
       = 0.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaWeights_m.
  super_Matrix<float,_7,_1>.super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.m_storage.
  m_data.array[5] = 3.0;
  local_70._0_4_ = 0x40a00000;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_> *)local_f0,
                      (Scalar *)local_70);
  local_128 = 5.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
                     (pCVar1,&stack0xfffffffffffffed8);
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
  [0xc] = 5.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
                     (pCVar1,sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>
                             .m_storage.m_data.array + 0xc);
  local_108._0_4_ = 5.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
                     (pCVar1,(Scalar *)local_108);
  local_50[0] = 5.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_(pCVar1,local_50)
  ;
  s = K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array + 4;
  K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] = 5.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_(pCVar1,s);
  if ((sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.
       array._16_8_ +
       sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.
       array._0_8_ == 7) &&
     (sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
      ._8_8_ == 1)) {
    sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
    [0] = 0.0;
    sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
    [1] = 0.0;
    sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
    [2] = 1.4013e-45;
    sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
    [3] = 0.0;
    sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
    [4] = 1.4013e-45;
    sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
    [5] = 0.0;
    K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
         2.0;
    local_70._0_4_ = 0x40400000;
    local_f0 = (undefined1  [8])s;
    Eigen::CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::operator_
              ((CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)local_f0,(Scalar *)local_70
              );
    if ((sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.
         array._16_8_ +
         sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.
         array._0_8_ == 2) &&
       (sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.
        array._8_8_ == 1)) {
      K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[0] = 0.0;
      K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[1] = 0.0;
      K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[2] =
           1.4013e-45;
      K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[3] = 0.0;
      K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
           1.4013e-45;
      K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] = 0.0;
      local_f0._0_4_ = 0x3f800000;
      local_128 = 2.0;
      local_70 = (undefined1  [8])local_f0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_> *)local_70,
                          &stack0xfffffffffffffed8);
      sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
      [0xc] = 1.0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar2,sigmaPoints.
                                 super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.
                                 m_storage.m_data.array + 0xc);
      local_108._0_4_ = 1.0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar2,(Scalar *)local_108);
      local_50[0] = 0.0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar2,local_50);
      local_38.ptr_._0_4_ = 1.0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar2,(Scalar *)&local_38);
      gtest_ar.message_.ptr_._0_4_ = 0x3f800000;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar2,(Scalar *)&gtest_ar.message_);
      local_74 = 2.0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar2,&local_74);
      local_78 = 3.0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar2,&local_78);
      local_8c = 3.0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar2,&local_8c);
      local_88 = 2.0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar2,&local_88);
      local_84 = 1.0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar2,&local_84);
      local_80 = 1.0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar2,&local_80);
      local_7c = 2.0;
      Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_(pCVar2,&local_7c);
      if ((K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array.
           _16_8_ + K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
                    array._0_8_ == 2) &&
         (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array._8_8_
          == 7)) {
        K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[0] =
             0.0;
        K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[1] =
             0.0;
        K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[2] =
             1.4013e-45;
        K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[3] =
             0.0;
        K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
             1.4013e-45;
        K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] =
             0.0;
        local_108._0_4_ = 35.0;
        local_128 = 34.0;
        local_70 = (undefined1  [8])local_108;
        pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_
                           ((CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *)local_70,
                            &stack0xfffffffffffffed8);
        sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.
        array[0xc] = 34.0;
        pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_
                           (pCVar3,sigmaPoints.
                                   super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.
                                   m_storage.m_data.array + 0xc);
        local_50[0] = 46.0;
        Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_(pCVar3,local_50);
        if ((K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array.
             _16_8_ + K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data
                      .array._0_8_ == 2) &&
           (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array.
            _8_8_ == 2)) {
          this_01 = (CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> *)local_70;
          K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[0] =
               0.0;
          K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[1] =
               0.0;
          K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[2] =
               1.4013e-45;
          K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[3] =
               0.0;
          K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
               1.4013e-45;
          K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] =
               0.0;
          local_218._0_4_ = 3.0;
          local_128 = 5.0;
          local_70 = (undefined1  [8])local_218;
          this_00 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                              ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)this_01,
                               &stack0xfffffffffffffed8);
          sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.
          array[0xc] = 7.0;
          Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                    (this_00,sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>
                             .m_storage.m_data.array + 0xc);
          if ((K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array.
               _16_8_ + K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.
                        m_data.array._0_8_ == 3) &&
             (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array.
              _8_8_ == 1)) {
            local_70 = (undefined1  [8])
                       ((long)&ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                               sigmaWeights_c.super_Matrix<float,_7,_1>.
                               super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.m_storage
                               .m_data + 0x14);
            K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[0]
                 = 0.0;
            K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[1]
                 = 0.0;
            K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[2]
                 = 1.4013e-45;
            K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[3]
                 = 0.0;
            K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4]
                 = 1.4013e-45;
            K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5]
                 = 0.0;
            ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaWeights_c.
            super_Matrix<float,_7,_1>.super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.
            m_storage.m_data.array[5] = 3.0;
            local_128 = 5.0;
            pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (this_01,(Scalar *)&stack0xfffffffffffffed8);
            sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data
            .array[0xc] = 3.0;
            pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar4,sigmaPoints.
                                       super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.
                                       m_storage.m_data.array + 0xc);
            local_50[0] = 3.0;
            pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar4,local_50);
            local_38.ptr_._0_4_ = 1.0;
            pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar4,(Scalar *)&local_38);
            gtest_ar.message_.ptr_._0_4_ = 0x40400000;
            pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar4,(Scalar *)&gtest_ar.message_);
            local_74 = 3.0;
            pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar4,&local_74);
            local_78 = 5.0;
            pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar4,&local_78);
            local_8c = 7.0;
            pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar4,&local_8c);
            local_88 = 7.0;
            pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar4,&local_88);
            local_84 = 5.0;
            pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar4,&local_84);
            local_80 = 3.0;
            pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar4,&local_80);
            local_7c = 3.0;
            pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar4,&local_7c);
            ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
            super_StandardBase<Kalman::Vector<float,_3>_>.P.
            super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
                 5.0;
            pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar4,(float *)((long)&ukf.
                                                  super_StandardFilterBase<Kalman::Vector<float,_3>_>
                                                  .super_StandardBase<Kalman::Vector<float,_3>_>.P.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data + 0x1c));
            ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
            super_StandardBase<Kalman::Vector<float,_3>_>.P.
            super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
                 7.0;
            pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar4,(float *)((long)&ukf.
                                                  super_StandardFilterBase<Kalman::Vector<float,_3>_>
                                                  .super_StandardBase<Kalman::Vector<float,_3>_>.P.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data + 0x20));
            local_140 = 11.0;
            pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar4,&stack0xfffffffffffffec0);
            local_13c = 9.0;
            pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar4,&stack0xfffffffffffffec4);
            local_138 = 9.0;
            pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar4,&stack0xfffffffffffffec8);
            local_134 = 3.0;
            pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar4,&stack0xfffffffffffffecc);
            local_130 = 5.0;
            pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                               (pCVar4,&stack0xfffffffffffffed0);
            local_12c = 5.0;
            Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                      (pCVar4,&stack0xfffffffffffffed4);
            if ((K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
                 array._16_8_ +
                 K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
                 array._0_8_ == 3) &&
               (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
                ._8_8_ == 7)) {
              K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
              [0] = 0.0;
              K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
              [1] = 0.0;
              K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
              [2] = 1.4013e-45;
              K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
              [3] = 0.0;
              K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
              [4] = 1.4013e-45;
              K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
              [5] = 0.0;
              local_128 = 20.0;
              mean.super_Matrix<float,_2,_1>.
              super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array =
                   (Matrix<float,_2,_1>)
                   (sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.
                    m_storage.m_data.array + 0xc);
              sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.
              m_data.array[0xc] = 20.0;
              local_70 = (undefined1  [8])&stack0xfffffffffffffed8;
              pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                                 ((CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)local_70
                                  ,(Scalar *)
                                   mean.super_Matrix<float,_2,_1>.
                                   super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                                   m_storage.m_data.array);
              local_50[0] = 20.0;
              pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                                 (pCVar5,local_50);
              local_38.ptr_._0_4_ = 40.0;
              pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                                 (pCVar5,(Scalar *)&local_38);
              gtest_ar.message_.ptr_._0_4_ = 0x42200000;
              pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                                 (pCVar5,(Scalar *)&gtest_ar.message_);
              local_74 = 60.0;
              Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                        (pCVar5,&local_74);
              if ((K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
                   array._16_8_ +
                   K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
                   array._0_8_ == 3) &&
                 (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
                  array._8_8_ == 2)) {
                local_70 = (undefined1  [8])
                           (sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.
                            m_storage.m_data.array + 0xc);
                K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
                [0] = 0.0;
                K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
                [1] = 0.0;
                K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
                [2] = 1.4013e-45;
                K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
                [3] = 0.0;
                K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
                [4] = 1.4013e-45;
                K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
                [5] = 0.0;
                sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.
                m_data.array[0xc] = 0.52863437;
                local_50[0] = 0.04405286;
                pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                                   ((CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)
                                    local_70,local_50);
                local_38.ptr_._0_4_ = -0.969163;
                pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                                   (pCVar5,(Scalar *)&local_38);
                gtest_ar.message_.ptr_._0_4_ = 0x3fcafedf;
                pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                                   (pCVar5,(Scalar *)&gtest_ar.message_);
                local_74 = -0.44052863;
                pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                                   (pCVar5,&local_74);
                local_78 = 1.6299559;
                Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                          (pCVar5,&local_78);
                if ((K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
                     array._16_8_ +
                     K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
                     array._0_8_ == 3) &&
                   (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
                    array._8_8_ == 2)) {
                  Kalman::UnscentedKalmanFilter<Kalman::Vector<float,_3>_>::
                  computeKalmanGain<Kalman::Vector<float,_2>_>
                            ((UnscentedKalmanFilter<Kalman::Vector<float,_3>_> *)local_218,
                             (Vector<float,_2> *)
                             (K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                              m_storage.m_data.array + 4),
                             (SigmaPoints<Kalman::Vector<float,_2>_> *)local_f0,
                             (Covariance<Kalman::Vector<float,_2>_> *)local_108,
                             (KalmanGain<Kalman::Vector<float,_2>_> *)this_01);
                  local_38.ptr_ =
                       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       0x3;
                  gtest_ar.message_.ptr_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
                  testing::internal::CmpHelperEQ<long,long>
                            ((internal *)local_50,"K_ref.rows()","K.rows()",(long *)&local_38,
                             (long *)&gtest_ar.message_);
                  if (local_50[0]._0_1_ == (internal)0x0) {
                    testing::Message::Message((Message *)&local_38);
                    if (gtest_ar._0_8_ == 0) {
                      pcVar6 = "";
                    }
                    else {
                      pcVar6 = *(char **)gtest_ar._0_8_;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
                               ,0x82,pcVar6);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar.message_);
                    if (local_38.ptr_ !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      bVar8 = testing::internal::IsTrue(true);
                      if ((bVar8) &&
                         (local_38.ptr_ !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0)) {
                        (**(code **)(*(long *)local_38.ptr_ + 8))();
                      }
                      local_38.ptr_ =
                           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                            *)0x0;
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&gtest_ar,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                  }
                  else {
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&gtest_ar,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                    local_38.ptr_ =
                         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x2;
                    gtest_ar.message_.ptr_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
                    testing::internal::CmpHelperEQ<long,long>
                              ((internal *)local_50,"K_ref.cols()","K.cols()",(long *)&local_38,
                               (long *)&gtest_ar.message_);
                    if (local_50[0]._0_1_ == (internal)0x0) {
                      testing::Message::Message((Message *)&local_38);
                      if (gtest_ar._0_8_ == 0) {
                        pcVar6 = "";
                      }
                      else {
                        pcVar6 = *(char **)gtest_ar._0_8_;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
                                 ,0x82,pcVar6);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar.message_);
                      if (local_38.ptr_ !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0) {
                        bVar8 = testing::internal::IsTrue(true);
                        if ((bVar8) &&
                           (local_38.ptr_ !=
                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)0x0)) {
                          (**(code **)(*(long *)local_38.ptr_ + 8))();
                        }
                        local_38.ptr_ =
                             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                              *)0x0;
                      }
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0);
                    }
                    else {
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0);
                      bVar8 = true;
                      P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage
                      .m_data.array._16_8_ = 0;
                      do {
                        lVar7 = 0;
                        do {
                          if (!bVar8) {
                            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",
                                          0x16f,
                                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<float, 3, 2>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<float, 3, 2>, Level = 1]"
                                         );
                          }
                          testing::internal::DoubleNearPredFormat
                                    ((internal *)local_50,"K_ref(i,j)","K(i,j)","1e-6",
                                     (double)*(float *)((long)mean.super_Matrix<float,_2,_1>.
                                                                                                                            
                                                  super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>
                                                  .m_storage.m_data.array + lVar7),
                                     (double)*(float *)((long)&this_01->m_xpr + lVar7),1e-06);
                          if (local_50[0]._0_1_ == (internal)0x0) {
                            testing::Message::Message((Message *)&local_38);
                            if (gtest_ar._0_8_ == 0) {
                              pcVar6 = "";
                            }
                            else {
                              pcVar6 = *(char **)gtest_ar._0_8_;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
                                       ,0x82,pcVar6);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar.message_);
                            if (local_38.ptr_ !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)0x0) {
                              bVar8 = testing::internal::IsTrue(true);
                              if ((bVar8) &&
                                 (local_38.ptr_ !=
                                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0)) {
                                (**(code **)(*(long *)local_38.ptr_ + 8))();
                              }
                              local_38.ptr_ =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)0x0;
                            }
                            testing::internal::
                            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&gtest_ar,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0);
                            return;
                          }
                          testing::internal::
                          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&gtest_ar,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0);
                          lVar7 = lVar7 + 0xc;
                        } while (lVar7 == 0xc);
                        bVar8 = (ulong)P_xy_ref.
                                       super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                                       m_storage.m_data.array._16_8_ < 2;
                        P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                        m_storage.m_data.array._16_8_ =
                             P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                             m_storage.m_data.array._16_8_ + 1;
                        mean.super_Matrix<float,_2,_1>.
                        super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data
                        .array = (Matrix<float,_2,_1>)
                                 ((long)mean.super_Matrix<float,_2,_1>.
                                        super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                                        m_storage.m_data.array + 4);
                        this_01 = (CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> *)
                                  ((long)&this_01->m_xpr + 4);
                      } while (P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                               m_storage.m_data.array._16_8_ != 3);
                    }
                  }
                  return;
                }
              }
              pcVar6 = 
              "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 3, 2>>::finished() [MatrixType = Eigen::Matrix<float, 3, 2>]"
              ;
            }
            else {
              pcVar6 = 
              "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 3, 7>>::finished() [MatrixType = Eigen::Matrix<float, 3, 7>]"
              ;
            }
          }
          else {
            pcVar6 = 
            "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 3, 1>>::finished() [MatrixType = Eigen::Matrix<float, 3, 1>]"
            ;
          }
        }
        else {
          pcVar6 = 
          "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 2, 2>>::finished() [MatrixType = Eigen::Matrix<float, 2, 2>]"
          ;
        }
      }
      else {
        pcVar6 = 
        "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 2, 7>>::finished() [MatrixType = Eigen::Matrix<float, 2, 7>]"
        ;
      }
    }
    else {
      pcVar6 = 
      "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 2, 1>>::finished() [MatrixType = Eigen::Matrix<float, 2, 1>]"
      ;
    }
  }
  else {
    pcVar6 = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 7, 1>>::finished() [MatrixType = Eigen::Matrix<float, 7, 1>]"
    ;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,pcVar6);
}

Assistant:

TEST(UnscentedKalmanFilter, computeKalmanGain) {
    T alpha = 1, beta = 2, kappa = 1;
    
    auto ukf = UnscentedKalmanFilter<Vector<T, 3>>(alpha,beta,kappa);
    
    ukf.sigmaWeights_c << 3, 5, 5, 5, 5, 5, 5;
    
    Vector<T,2> mean;
    mean << 2, 3;
    
    typename UnscentedKalmanFilter<Vector<T, 3>>::template SigmaPoints<decltype(mean)> sigmaPoints;
    sigmaPoints <<
        1,  2,  1,  1,  0,  1,  1,
        2,  3,  3,  2,  1,  1,  2;
    
    Matrix<T,2,2> P_yy;
    P_yy <<
        35, 34,
        34, 46;
    
    // x and sigmaStatePoints
    ukf.x << 3, 5, 7;
    ukf.sigmaStatePoints <<
        3,  5, 3, 3, 1, 3, 3,
        5,  7, 7, 5, 3, 3, 5,
        7, 11, 9, 9, 3, 5, 5;
    
    // Reference value for P
    Matrix<T,3,2> P_xy_ref;
    P_xy_ref <<
        20, 20,
        20, 40,
        40, 60;
    
    // Reference value for K
    Matrix<T, 3, 2> K_ref;
    K_ref <<
        0.528634361233480, 0.044052863436123,
       -0.969162995594713, 1.585903083700440,
       -0.440528634361233, 1.629955947136563;
    
    // Kalman gain to be computed
    Matrix<T, 3, 2> K;
    ukf.computeKalmanGain(mean, sigmaPoints, P_yy, K);
    
    ASSERT_MATRIX_NEAR(K_ref, K, 1e-6);
}